

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void flush_before_commit_multi_writers_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t bodylen;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  fdb_doc *rdoc;
  fdb_kvs_handle *db1;
  fdb_kvs_handle *db2;
  fdb_file_handle *dbfile1;
  fdb_file_handle *dbfile2;
  fdb_doc *apfStack_4a8 [11];
  fdb_kvs_config local_450;
  timeval __test_begin;
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 8;
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  local_128.wal_flush_before_commit = true;
  fdb_get_default_kvs_config();
  fdb_open(&dbfile1,"dummy1",&local_128);
  fdb_kvs_open(dbfile1,&db1,(char *)0x0,&local_450);
  lVar10 = 0;
  for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
    sprintf(keybuf,"key%d",uVar7 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar7 & 0xffffffff);
    sVar5 = strlen(keybuf);
    sVar6 = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_4a8 + lVar10),keybuf,sVar5,metabuf,sVar6,bodybuf,
                   bodylen);
    fdb_set(db1,apfStack_4a8[uVar7]);
    lVar10 = lVar10 + 8;
  }
  fdb_commit(dbfile1,'\x01');
  fdb_open(&dbfile2,"dummy1",&local_128);
  fdb_kvs_open(dbfile2,&db2,(char *)0x0,&local_450);
  lVar10 = 0;
  for (uVar7 = 0; uVar7 != 5; uVar7 = uVar7 + 1) {
    sprintf(metabuf,"meta2%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body2%d(db2)",uVar7 & 0xffffffff);
    sVar5 = strlen(metabuf);
    sVar6 = strlen(bodybuf);
    fdb_doc_update((fdb_doc **)((long)apfStack_4a8 + lVar10),metabuf,sVar5,bodybuf,sVar6);
    fdb_set(db2,apfStack_4a8[uVar7]);
    lVar10 = lVar10 + 8;
  }
  lVar10 = 0x28;
  for (uVar7 = 5; uVar7 != 10; uVar7 = uVar7 + 1) {
    sprintf(metabuf,"meta2%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body2%d(db1)",uVar7 & 0xffffffff);
    sVar5 = strlen(metabuf);
    sVar6 = strlen(bodybuf);
    fdb_doc_update((fdb_doc **)((long)apfStack_4a8 + lVar10),metabuf,sVar5,bodybuf,sVar6);
    fdb_set(db1,apfStack_4a8[uVar7]);
    lVar10 = lVar10 + 8;
  }
  uVar7 = 0;
  while( true ) {
    uVar9 = (uint)uVar7;
    if (uVar9 == 10) {
      fdb_commit(dbfile1,'\0');
      fdb_commit(dbfile2,'\0');
      uVar9 = 0;
      while( true ) {
        if (uVar9 == 10) {
          fdb_close(dbfile1);
          fdb_close(dbfile2);
          for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
            fdb_doc_free(apfStack_4a8[lVar10]);
          }
          fdb_shutdown();
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar8,"flush before commit with multi writers test");
          return;
        }
        sprintf(keybuf,"key%d",(ulong)uVar9);
        sprintf(metabuf,"meta2%d",(ulong)uVar9);
        pcVar8 = "body2%d(db1)";
        if (uVar9 < 5) {
          pcVar8 = "body2%d(db2)";
        }
        sprintf(bodybuf,pcVar8,(ulong)uVar9);
        sVar5 = strlen(keybuf);
        fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get(db1,rdoc);
        pfVar2 = rdoc;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe92);
          flush_before_commit_multi_writers_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe92,"void flush_before_commit_multi_writers_test()");
        }
        pvVar1 = rdoc->meta;
        iVar4 = bcmp(metabuf,pvVar1,rdoc->metalen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,metabuf,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe93);
          flush_before_commit_multi_writers_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe93,"void flush_before_commit_multi_writers_test()");
        }
        pvVar1 = pfVar2->body;
        iVar4 = bcmp(bodybuf,pvVar1,pfVar2->bodylen);
        if (iVar4 != 0) break;
        fdb_doc_free(pfVar2);
        rdoc = (fdb_doc *)0x0;
        sVar5 = strlen(keybuf);
        fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get(db2,rdoc);
        pfVar2 = rdoc;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe9c);
          flush_before_commit_multi_writers_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe9c,"void flush_before_commit_multi_writers_test()");
        }
        pvVar1 = rdoc->meta;
        iVar4 = bcmp(metabuf,pvVar1,rdoc->metalen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,metabuf,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe9d);
          flush_before_commit_multi_writers_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe9d,"void flush_before_commit_multi_writers_test()");
        }
        pvVar1 = pfVar2->body;
        iVar4 = bcmp(bodybuf,pvVar1,pfVar2->bodylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,bodybuf,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe9e);
          flush_before_commit_multi_writers_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe9e,"void flush_before_commit_multi_writers_test()");
        }
        fdb_doc_free(pfVar2);
        rdoc = (fdb_doc *)0x0;
        uVar9 = uVar9 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,bodybuf,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe94);
      flush_before_commit_multi_writers_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe94,"void flush_before_commit_multi_writers_test()");
    }
    sprintf(keybuf,"key%d",uVar7);
    sprintf(metabuf,"meta2%d",uVar7);
    pcVar8 = "body2%d(db1)";
    if (uVar9 < 5) {
      pcVar8 = "body2%d(db2)";
    }
    sprintf(bodybuf,pcVar8,uVar7);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db1,rdoc);
    pfVar2 = rdoc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe71);
      flush_before_commit_multi_writers_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe71,"void flush_before_commit_multi_writers_test()");
    }
    pvVar1 = rdoc->meta;
    iVar4 = bcmp(metabuf,pvVar1,rdoc->metalen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,metabuf,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe72);
      flush_before_commit_multi_writers_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe72,"void flush_before_commit_multi_writers_test()");
    }
    pvVar1 = pfVar2->body;
    iVar4 = bcmp(bodybuf,pvVar1,pfVar2->bodylen);
    if (iVar4 != 0) break;
    fdb_doc_free(pfVar2);
    rdoc = (fdb_doc *)0x0;
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db2,rdoc);
    pfVar2 = rdoc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe7b);
      flush_before_commit_multi_writers_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe7b,"void flush_before_commit_multi_writers_test()");
    }
    pvVar1 = rdoc->meta;
    iVar4 = bcmp(metabuf,pvVar1,rdoc->metalen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,metabuf,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe7c);
      flush_before_commit_multi_writers_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe7c,"void flush_before_commit_multi_writers_test()");
    }
    pvVar1 = pfVar2->body;
    iVar4 = bcmp(bodybuf,pvVar1,pfVar2->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,bodybuf,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe7d);
      flush_before_commit_multi_writers_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe7d,"void flush_before_commit_multi_writers_test()");
    }
    fdb_doc_free(pfVar2);
    rdoc = (fdb_doc *)0x0;
    uVar7 = (ulong)(uVar9 + 1);
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,bodybuf,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xe73);
  flush_before_commit_multi_writers_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xe73,"void flush_before_commit_multi_writers_test()");
}

Assistant:

void flush_before_commit_multi_writers_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile1, *dbfile2;
    fdb_kvs_handle *db1, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 8;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    kvs_config = fdb_get_default_kvs_config();

    // open db
    fdb_open(&dbfile1, "dummy1", &fconfig);
    fdb_kvs_open(dbfile1, &db1, NULL, &kvs_config);

    // create & insert docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open second writer
    fdb_open(&dbfile2, "dummy1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);

    for (i=0;i<n/2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db2)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc[i]);
    }
    for (i=n/2;i<n;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db1)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }

    // retrieve before commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_commit(dbfile1, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);

    // retrieve after commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_close(dbfile1);
    fdb_close(dbfile2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit with multi writers test");
}